

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_html(REF_GRID ref_grid,char *filename)

{
  REF_NODE ref_node_00;
  REF_CELL pRVar1;
  REF_STATUS RVar2;
  FILE *__stream;
  REF_INT *pRStack_c8;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT nodes [27];
  int local_40;
  int local_3c;
  REF_INT cell;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *f;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x709,
           "ref_export_html","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    ref_grid_local._4_4_ = ref_node_compact(ref_node_00,&n2o,&stack0xffffffffffffff38);
    if (ref_grid_local._4_4_ == 0) {
      fprintf(__stream,"<html>\n");
      fprintf(__stream,"  <head>\n");
      fprintf(__stream,"    <title>refine export</title>\n");
      fprintf(__stream,"    <link rel=\'stylesheet\' type=\'text/css\'\n");
      fprintf(__stream,"          href=\'http://www.x3dom.org/download/x3dom.css\'>\n");
      fprintf(__stream,"    </link>\n");
      fprintf(__stream,"    <script type=\'text/javascript\'\n");
      fprintf(__stream,"          src=\'http://www.x3dom.org/download/x3dom.js\'>\n");
      fprintf(__stream,"    </script>\n");
      fprintf(__stream,"    <style>\n");
      fprintf(__stream,"      x3d {width:100%%;height:100%%;border:none}\n");
      fprintf(__stream,"      body {margin:0;width:100%%;height:100%%;}\n");
      fprintf(__stream,"    </style>\n");
      fprintf(__stream,"  </head>\n");
      fprintf(__stream,"  <body id=\'body\'>\n");
      fprintf(__stream,"    <a href=\"http://x3dom.org/docs/dev/navigation.html\">\n");
      fprintf(__stream,"camera control help\n");
      fprintf(__stream,"    </a>\n");
      fprintf(__stream,"    <x3d id=\'x3d\'><scene><shape>\n");
      fprintf(__stream,"      <IndexedLineSet coordIndex=\'\n");
      pRVar1 = ref_grid->cell[3];
      for (local_40 = 0; local_40 < pRVar1->max; local_40 = local_40 + 1) {
        RVar2 = ref_cell_nodes(pRVar1,local_40,(REF_INT *)&o2n);
        if (RVar2 == 0) {
          for (local_3c = 0; local_3c < pRVar1->node_per; local_3c = local_3c + 1) {
            fprintf(__stream," %d",(ulong)(uint)n2o[nodes[(long)local_3c + -2]]);
          }
          fprintf(__stream," %d %d\n",(ulong)(uint)n2o[(int)o2n],0xffffffff);
        }
      }
      pRVar1 = ref_grid->cell[6];
      for (local_40 = 0; local_40 < pRVar1->max; local_40 = local_40 + 1) {
        RVar2 = ref_cell_nodes(pRVar1,local_40,(REF_INT *)&o2n);
        if (RVar2 == 0) {
          for (local_3c = 0; local_3c < pRVar1->node_per; local_3c = local_3c + 1) {
            fprintf(__stream," %d",(ulong)(uint)n2o[nodes[(long)local_3c + -2]]);
          }
          fprintf(__stream," %d %d\n",(ulong)(uint)n2o[(int)o2n],0xffffffff);
        }
      }
      pRVar1 = ref_grid->cell[8];
      for (local_40 = 0; local_40 < pRVar1->max; local_40 = local_40 + 1) {
        RVar2 = ref_cell_nodes(pRVar1,local_40,(REF_INT *)&o2n);
        if (RVar2 == 0) {
          fprintf(__stream," %d %d %d %d %d %d %d %d\n",(ulong)(uint)n2o[(int)o2n],
                  (ulong)(uint)n2o[o2n._4_4_],(ulong)(uint)n2o[nodes[0]],(ulong)(uint)n2o[nodes[1]],
                  n2o[(int)o2n],n2o[nodes[1]],n2o[o2n._4_4_],0xffffffff);
        }
      }
      fprintf(__stream,"      \' >\n");
      fprintf(__stream,"      <Coordinate point=\'\n");
      for (local_3c = 0; local_3c < ref_node_00->n; local_3c = local_3c + 1) {
        fprintf(__stream," %.15e",ref_node_00->real[pRStack_c8[local_3c] * 0xf]);
        fprintf(__stream," %.15e",ref_node_00->real[pRStack_c8[local_3c] * 0xf + 1]);
        fprintf(__stream," %.15e\n",ref_node_00->real[pRStack_c8[local_3c] * 0xf + 2]);
      }
      fprintf(__stream,"      \' />\n");
      fprintf(__stream,"      </IndexedLineSet>\n");
      fprintf(__stream,"    </shape></scene></x3d>\n");
      fprintf(__stream,"  </body>\n");
      fprintf(__stream,"</html>\n");
      if (pRStack_c8 != (REF_INT *)0x0) {
        free(pRStack_c8);
      }
      if (n2o != (REF_INT *)0x0) {
        free(n2o);
      }
      fclose(__stream);
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x70b,"ref_export_html",(ulong)ref_grid_local._4_4_,"compact");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_html(REF_GRID ref_grid,
                                          const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *o2n, *n2o;

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  fprintf(f, "<html>\n");
  fprintf(f, "  <head>\n");
  fprintf(f, "    <title>refine export</title>\n");
  fprintf(f, "    <link rel='stylesheet' type='text/css'\n");
  fprintf(f, "          href='http://www.x3dom.org/download/x3dom.css'>\n");
  fprintf(f, "    </link>\n");
  fprintf(f, "    <script type='text/javascript'\n");
  fprintf(f, "          src='http://www.x3dom.org/download/x3dom.js'>\n");
  fprintf(f, "    </script>\n");
  fprintf(f, "    <style>\n");
  fprintf(f, "      x3d {width:100%%;height:100%%;border:none}\n");
  fprintf(f, "      body {margin:0;width:100%%;height:100%%;}\n");
  fprintf(f, "    </style>\n");
  fprintf(f, "  </head>\n");
  fprintf(f, "  <body id='body'>\n");
  fprintf(f, "    <a href=\"http://x3dom.org/docs/dev/navigation.html\">\n");
  fprintf(f, "camera control help\n");
  fprintf(f, "    </a>\n");
  fprintf(f, "    <x3d id='x3d'><scene><shape>\n");

  fprintf(f, "      <IndexedLineSet coordIndex='\n");
  if (REF_TRUE) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        fprintf(f, " %d", o2n[nodes[node]]);
      fprintf(f, " %d %d\n", o2n[nodes[0]], -1);
    }
  }

  if (REF_TRUE) {
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        fprintf(f, " %d", o2n[nodes[node]]);
      fprintf(f, " %d %d\n", o2n[nodes[0]], -1);
    }
  }

  if (REF_TRUE) {
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      fprintf(f, " %d %d %d %d %d %d %d %d\n", o2n[nodes[0]], o2n[nodes[1]],
              o2n[nodes[2]], o2n[nodes[3]], o2n[nodes[0]], o2n[nodes[3]],
              o2n[nodes[1]], -1);
    }
  }

  fprintf(f, "      ' >\n");

  fprintf(f, "      <Coordinate point='\n");
  for (node = 0; node < ref_node_n(ref_node); node++) {
    fprintf(f, " %.15e", ref_node_xyz(ref_node, 0, n2o[node]));
    fprintf(f, " %.15e", ref_node_xyz(ref_node, 1, n2o[node]));
    fprintf(f, " %.15e\n", ref_node_xyz(ref_node, 2, n2o[node]));
  }
  fprintf(f, "      ' />\n");

  fprintf(f, "      </IndexedLineSet>\n");

  fprintf(f, "    </shape></scene></x3d>\n");
  fprintf(f, "  </body>\n");
  fprintf(f, "</html>\n");

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}